

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_parser.c
# Opt level: O0

RK_S32 av1d_split_frame(Av1CodecContext *ctx,RK_U8 **out_data,RK_S32 *out_size,RK_U8 *data,
                       RK_S32 size)

{
  int iVar1;
  int iVar2;
  RK_S32 RVar3;
  RK_S32 len;
  uint8_t *end;
  uint8_t *ptr;
  AV1OBU obu;
  RK_S32 size_local;
  RK_U8 *data_local;
  RK_S32 *out_size_local;
  RK_U8 **out_data_local;
  Av1CodecContext *ctx_local;
  
  obu._132_4_ = size;
  if ((av1d_debug & 1) != 0) {
    _mpp_log_l(4,"av1d_parser","enter ctx %p\n","av1d_split_frame",ctx);
  }
  *out_data = data;
  end = data;
  while( true ) {
    iVar1 = (int)end;
    iVar2 = (int)data;
    if ((data + size <= end) || (RVar3 = av1_extract_obu((AV1OBU *)&ptr,end,obu._132_4_), RVar3 < 0)
       ) {
      *out_size = iVar1 - iVar2;
      return iVar1 - iVar2;
    }
    if ((((int)obu.gb.update_curbyte == 3) || ((int)obu.gb.update_curbyte == 6)) ||
       ((((int)obu.gb.update_curbyte == 2 ||
         (((int)obu.gb.update_curbyte == 5 || ((int)obu.gb.update_curbyte == 1)))) &&
        (ctx->frame_header != 0)))) {
      ctx->frame_header = ctx->frame_header + 1;
    }
    if (ctx->frame_header == 2) break;
    if ((int)obu.gb.update_curbyte == 6) {
      *out_size = (iVar1 + RVar3) - iVar2;
      ctx->new_frame = 1;
      ctx->frame_header = 0;
      return (iVar1 + RVar3) - iVar2;
    }
    end = end + RVar3;
    obu._132_4_ = obu._132_4_ - RVar3;
  }
  *out_size = iVar1 - iVar2;
  ctx->new_frame = 1;
  ctx->frame_header = 0;
  return iVar1 - iVar2;
}

Assistant:

RK_S32 av1d_split_frame(Av1CodecContext *ctx,
                        RK_U8 **out_data, RK_S32 *out_size,
                        RK_U8 *data, RK_S32 size)
{
    (void)out_data;
    (void)out_size;

    AV1OBU obu;
    uint8_t *ptr = data, *end = data + size;
    av1d_dbg_func("enter ctx %p\n", ctx);

    *out_data = data;

    while (ptr < end) {
        RK_S32 len = av1_extract_obu(&obu, ptr, size);
        if (len < 0)
            break;
        if (obu.type == AV1_OBU_FRAME_HEADER || obu.type == AV1_OBU_FRAME ||
            ((obu.type == AV1_OBU_TEMPORAL_DELIMITER || obu.type == AV1_OBU_METADATA ||
              obu.type == AV1_OBU_SEQUENCE_HEADER) && ctx->frame_header))
            ctx->frame_header ++;
        if (ctx->frame_header == 2) {
            *out_size = (RK_S32)(ptr - data);
            ctx->new_frame = 1;
            ctx->frame_header = 0;
            return ptr - data;
        }
        if (obu.type == AV1_OBU_FRAME) {
            ptr      += len;
            size     -= len;
            *out_size = (RK_S32)(ptr - data);
            ctx->new_frame = 1;
            ctx->frame_header = 0;
            return ptr - data;
        }
        ptr      += len;
        size -= len;
    }

    *out_size = (RK_S32)(ptr - data);

    return ptr - data;

    av1d_dbg_func("leave ctx %p\n", ctx);

    return 0;
}